

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.cpp
# Opt level: O2

bool duckdb::VectorStringToList::SplitStringList
               (string_t *input,string_t *child_data,idx_t *child_start,Vector *child)

{
  bool bVar1;
  idx_t start;
  idx_t end;
  char *buf;
  bool bVar2;
  idx_t pos;
  idx_t len;
  optional_idx start_pos;
  SplitStringListOperation state;
  StringCastInputState input_state;
  idx_t local_88;
  ulong local_80;
  optional_idx local_78;
  idx_t local_70;
  SplitStringListOperation local_68;
  StringCastInputState local_50;
  
  local_50.pos = &local_88;
  local_80 = (ulong)(input->value).pointer.length;
  if (local_80 < 0xd) {
    buf = (input->value).pointer.prefix;
  }
  else {
    buf = (input->value).pointer.ptr;
  }
  local_50.len = &local_80;
  local_88 = 0;
  local_50.escaped = false;
  local_68.child_data = child_data;
  local_68.entry_count = child_start;
  local_68.child = child;
  local_50.buf = buf;
  SkipWhitespace(&local_50);
  if ((local_88 == local_80) || (buf[local_88] != '[')) {
LAB_016d5a6b:
    bVar2 = false;
  }
  else {
    local_88 = local_88 + 1;
    SkipWhitespace(&local_50);
    bVar2 = false;
    while (local_88 < local_80) {
      local_78.index = 0xffffffffffffffff;
      while (((local_88 < local_80 && (buf[local_88] != ',')) && (buf[local_88] != ']'))) {
        bVar1 = ValueStateTransition(&local_50,&local_78,&local_70);
        if (!bVar1) goto LAB_016d5a6b;
      }
      if (local_88 == local_80) goto LAB_016d5a6b;
      if (buf[local_88] == ']') {
        if (local_78.index != 0xffffffffffffffff) {
LAB_016d5a20:
          start = optional_idx::GetIndex(&local_78);
          end = local_70 + 1;
          goto LAB_016d5a45;
        }
        if (bVar2) goto LAB_016d5a3b;
        bVar2 = false;
      }
      else {
        if (local_78.index != 0xffffffffffffffff) goto LAB_016d5a20;
LAB_016d5a3b:
        start = 0;
        end = 0;
LAB_016d5a45:
        SplitStringListOperation::HandleValue(&local_68,buf,start,end);
        bVar2 = true;
      }
      if (buf[local_88] == ']') break;
      local_88 = local_88 + 1;
      SkipWhitespace(&local_50);
    }
    local_88 = local_88 + 1;
    SkipWhitespace(&local_50);
    bVar2 = local_88 == local_80;
  }
  return bVar2;
}

Assistant:

bool VectorStringToList::SplitStringList(const string_t &input, string_t *child_data, idx_t &child_start,
                                         Vector &child) {
	SplitStringListOperation state(child_data, child_start, child);
	return SplitStringListInternal<SplitStringListOperation>(input, state);
}